

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

CTcPrsNode * CTcPrsOpUnary::eval_const_not(CTcPrsNode *subexpr)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int iVar3;
  
  iVar1 = (*(subexpr->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    subexpr = (CTcPrsNode *)0x0;
  }
  else {
    iVar1 = (*(subexpr->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(subexpr);
    iVar2 = (*(subexpr->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(subexpr);
    iVar3 = 2;
    if (((CTcConstVal *)CONCAT44(extraout_var_01,iVar2))->typ_ != TC_CVT_NIL) {
      iVar2 = CTcConstVal::equals_zero((CTcConstVal *)CONCAT44(extraout_var_01,iVar2));
      iVar3 = 2 - (uint)(iVar2 == 0);
    }
    *(int *)CONCAT44(extraout_var_00,iVar1) = iVar3;
  }
  return subexpr;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::eval_const_not(CTcPrsNode *subexpr)
{
    /* 
     *   if the underlying expression is a constant value, apply the
     *   operator 
     */
    if (subexpr->is_const())
    {
        /* set the new value */
        subexpr->get_const_val()
            ->set_bool(!subexpr->get_const_val()->get_val_bool());

        /* return the modified constant value */
        return subexpr;
    }

    /* the result is not constant */
    return 0;
}